

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumConstantTexture *
pbrt::SpectrumConstantTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Allocator alloc_00;
  uintptr_t iptr;
  SpectrumHandle c;
  undefined1 local_60 [8];
  NamedTextures *local_58;
  long local_48;
  ulong local_38;
  
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0x3f800000;
  local_58 = (NamedTextures *)&stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"value","");
  alloc_00.memoryResource._4_4_ = 0;
  alloc_00.memoryResource._0_4_ = spectrumType;
  local_38 = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)local_60,(string *)parameters,(SpectrumHandle *)&local_58
             ,(SpectrumType)&stack0xffffffffffffffc8,alloc_00);
  if (local_58 != (NamedTextures *)&stack0xffffffffffffffb8) {
    operator_delete(local_58,local_48 + 1);
  }
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
  (((SpectrumConstantTexture *)CONCAT44(extraout_var_00,iVar1))->value).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (uintptr_t)local_60;
  return (SpectrumConstantTexture *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

SpectrumConstantTexture *SpectrumConstantTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    SpectrumHandle c = parameters.GetOneSpectrum("value", one, spectrumType, alloc);
    return alloc.new_object<SpectrumConstantTexture>(c);
}